

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

int anon_unknown.dwarf_a0a5e5::ParseIndex
              (string *str,optional<(anonymous_namespace)::Args> *progress,ArrayIndex max)

{
  bool bVar1;
  runtime_error *prVar2;
  cmAlphaNum *pcVar3;
  unsigned_long lindex;
  cmAlphaNum sizeStr;
  string local_e8;
  uint local_c0 [2];
  static_string_view local_b8;
  undefined8 local_a8;
  static_string_view local_a0;
  undefined1 local_90 [56];
  static_string_view local_58;
  static_string_view local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  bVar1 = cmStrToULong(str,(unsigned_long *)local_c0);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_b8.super_string_view._M_len = 0x1f;
    local_b8.super_string_view._M_str = "expected an array index, got: \'";
    local_a0.super_string_view._M_len = 1;
    local_a0.super_string_view._M_str = "\'";
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
              ((string *)local_90,&local_b8,str,&local_a0);
    local_e8.field_2._M_allocated_capacity =
         *(undefined8 *)
          &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
           super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged;
    local_e8._M_dataplus._M_p =
         *(pointer *)
          &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
           super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload;
    local_e8._M_string_length =
         *(size_type *)
          ((long)&(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload +
          8);
    std::runtime_error::runtime_error(prVar2,(string *)local_90);
    *(undefined ***)prVar2 = &PTR__runtime_error_00a07fe8;
    *(undefined4 *)(prVar2 + 0x10) = local_e8._M_dataplus._M_p._0_4_;
    *(undefined4 *)(prVar2 + 0x14) = local_e8._M_dataplus._M_p._4_4_;
    *(undefined4 *)(prVar2 + 0x18) = (undefined4)local_e8._M_string_length;
    *(undefined4 *)(prVar2 + 0x1c) = local_e8._M_string_length._4_4_;
    *(size_type *)(prVar2 + 0x20) = local_e8.field_2._M_allocated_capacity;
    __cxa_throw(prVar2,&(anonymous_namespace)::json_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  if (local_c0[0] < max) {
    return local_c0[0];
  }
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_90,max);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_a0.super_string_view._M_len = 0x1c;
  pcVar3 = (cmAlphaNum *)(local_90 + 0x10);
  if ((cmAlphaNum *)local_90._0_8_ != (cmAlphaNum *)0x0) {
    pcVar3 = (cmAlphaNum *)local_90._0_8_;
  }
  local_a0.super_string_view._M_str = "expected an index less than ";
  local_38._M_str = (char *)pcVar3->RValueString_;
  if ((cmAlphaNum *)local_90._0_8_ == (cmAlphaNum *)0x0) {
    local_90._0_8_ = (cmAlphaNum *)local_90;
  }
  local_38._M_len = (((cmAlphaNum *)local_90._0_8_)->View_)._M_len;
  local_48.super_string_view._M_len = 6;
  local_48.super_string_view._M_str = " got \'";
  local_58.super_string_view._M_len = 1;
  local_58.super_string_view._M_str = "\'";
  cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
            (&local_e8,&local_a0,&local_38,&local_48,str,&local_58);
  local_a8 = *(undefined8 *)
              &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
               super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged;
  local_b8.super_string_view._M_len =
       *(size_t *)
        &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
         super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload;
  local_b8.super_string_view._M_str =
       *(char **)((long)&(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
                         _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>.
                         _M_payload + 8);
  std::runtime_error::runtime_error(prVar2,(string *)&local_e8);
  *(undefined ***)prVar2 = &PTR__runtime_error_00a07fe8;
  *(undefined4 *)(prVar2 + 0x10) = (undefined4)local_b8.super_string_view._M_len;
  *(undefined4 *)(prVar2 + 0x14) = local_b8.super_string_view._M_len._4_4_;
  *(undefined4 *)(prVar2 + 0x18) = local_b8.super_string_view._M_str._0_4_;
  *(undefined4 *)(prVar2 + 0x1c) = local_b8.super_string_view._M_str._4_4_;
  *(undefined8 *)(prVar2 + 0x20) = local_a8;
  __cxa_throw(prVar2,&(anonymous_namespace)::json_error::typeinfo,std::runtime_error::~runtime_error
             );
}

Assistant:

int ParseIndex(
  const std::string& str, cm::optional<Args> const& progress = cm::nullopt,
  Json::ArrayIndex max = std::numeric_limits<Json::ArrayIndex>::max())
{
  unsigned long lindex;
  if (!cmStrToULong(str, &lindex)) {
    throw json_error(cmStrCat("expected an array index, got: '"_s, str, "'"_s),
                     progress);
  }
  Json::ArrayIndex index = static_cast<Json::ArrayIndex>(lindex);
  if (index >= max) {
    cmAlphaNum sizeStr{ max };
    throw json_error(cmStrCat("expected an index less than "_s, sizeStr.View(),
                              " got '"_s, str, "'"_s),
                     progress);
  }
  return index;
}